

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

tVertex __thiscall MeshLib::Solid::createVertex(Solid *this,int id)

{
  Vertex *this_00;
  int *piVar1;
  tVertex v;
  int id_local;
  Solid *this_local;
  
  this_00 = (Vertex *)operator_new(0xc0);
  Vertex::Vertex(this_00);
  piVar1 = Vertex::id(this_00);
  *piVar1 = id;
  AVL::Tree<MeshLib::Vertex>::insert(&this->m_verts,this_00);
  return this_00;
}

Assistant:

Solid::tVertex Solid::createVertex( int id )
{
	tVertex v = new Vertex();
	
	v->id() = id;
	m_verts.insert( v );
	return v;//insert a new vertex, with id as the key
}